

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_erase(wchar_t x,wchar_t y,wchar_t n)

{
  term_win *ptVar1;
  int *piVar2;
  wchar_t *pwVar3;
  int *piVar4;
  wchar_t *pwVar5;
  term *ptVar6;
  errr eVar7;
  wchar_t wVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  
  iVar9 = Term->wid;
  eVar7 = Term_gotoxy(x,y);
  ptVar6 = Term;
  if (eVar7 == 0) {
    wVar8 = iVar9 - x;
    if (n + x <= iVar9) {
      wVar8 = n;
    }
    ptVar1 = Term->scr;
    lVar10 = 0;
    if (wVar8 < L'\x01') {
      wVar8 = L'\0';
    }
    piVar2 = ptVar1->a[y];
    pwVar3 = ptVar1->c[y];
    piVar4 = ptVar1->ta[y];
    pwVar5 = ptVar1->tc[y];
    iVar9 = -1;
    iVar11 = -1;
    for (; wVar8 != (wchar_t)lVar10; lVar10 = lVar10 + 1) {
      if ((piVar2[x + lVar10] != 1) || (pwVar3[x + lVar10] != L' ')) {
        piVar2[x + lVar10] = 1;
        pwVar3[x + lVar10] = L' ';
        piVar4[x + lVar10] = 0;
        pwVar5[x + lVar10] = L'\0';
        iVar9 = x + (wchar_t)lVar10;
        if (iVar11 < 0) {
          iVar11 = iVar9;
        }
      }
    }
    eVar7 = 0;
    if (-1 < iVar11) {
      if (y < ptVar6->y1) {
        ptVar6->y1 = y;
      }
      if (ptVar6->y2 < y) {
        ptVar6->y2 = y;
      }
      if (iVar11 < ptVar6->x1[y]) {
        ptVar6->x1[y] = iVar11;
      }
      if (ptVar6->x2[y] < iVar9) {
        ptVar6->x2[y] = iVar9;
        eVar7 = 0;
      }
    }
  }
  else {
    eVar7 = -1;
  }
  return eVar7;
}

Assistant:

errr Term_erase(int x, int y, int n)
{
	int i;

	int w = Term->wid;
	/* int h = Term->hgt; */

	int x1 = -1;
	int x2 = -1;

	int *scr_aa;
	wchar_t *scr_cc;

	int *scr_taa;
	wchar_t *scr_tcc;

	/* Place cursor */
	if (Term_gotoxy(x, y)) return (-1);

	/* Force legal size */
	if (x + n > w) n = w - x;

	/* Fast access */
	scr_aa = Term->scr->a[y];
	scr_cc = Term->scr->c[y];

	scr_taa = Term->scr->ta[y];
	scr_tcc = Term->scr->tc[y];

	/* Scan every column */
	for (i = 0; i < n; i++, x++) {
		int oa = scr_aa[x];
		wchar_t oc = scr_cc[x];

		/* Hack -- Ignore "non-changes" */
		if ((oa == COLOUR_WHITE) && (oc == ' ')) continue;

		/* Save the "literal" information */
		scr_aa[x] = COLOUR_WHITE;
		scr_cc[x] = ' ';

		scr_taa[x] = 0;
		scr_tcc[x] = 0;

		/* Track minimum changed column */
		if (x1 < 0) x1 = x;

		/* Track maximum changed column */
		x2 = x;
	}

	/* Expand the "change area" as needed */
	if (x1 >= 0) {
		/* Check for new min/max row info */
		if (y < Term->y1) Term->y1 = y;
		if (y > Term->y2) Term->y2 = y;

		/* Check for new min/max col info in this row */
		if (x1 < Term->x1[y]) Term->x1[y] = x1;
		if (x2 > Term->x2[y]) Term->x2[y] = x2;
	}

	/* Success */
	return (0);
}